

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O2

void __thiscall
SolverAppTest_ParseOptions_Test::~SolverAppTest_ParseOptions_Test
          (SolverAppTest_ParseOptions_Test *this)

{
  SolverAppTest::~SolverAppTest(&this->super_SolverAppTest);
  operator_delete(this,0x5f8);
  return;
}

Assistant:

TEST_F(SolverAppTest, ParseOptions) {
  AddOption();
  RedirectOutput();
  EXPECT_CALL(handler_, OnOption()).WillOnce(Return(true));
  EXPECT_EQ(0, app_.Run(Args("test", "-w")));
}